

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateVirtualTableUpdate
          (ExpressionContext *ctx,SynBase *source,VariableData *vtable,
          SmallArray<FunctionData_*,_32U> *functionSet,SmallArray<TypeClass_*,_32U> *classTypes)

{
  uint uVar1;
  FunctionData *pFVar2;
  ModuleData *pMVar3;
  TypeBase *pTVar4;
  SynBase *source_00;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var10;
  char *pcVar11;
  FunctionData **ppFVar12;
  undefined4 extraout_var_02;
  ulong uVar13;
  TypeFunction *pTVar14;
  long lVar15;
  FunctionData *pFVar16;
  InplaceStr name_00;
  FunctionData *function;
  TypeBase *type;
  IntrusiveList<ExprBase> expressions;
  InplaceStr name;
  TraceScope traceScope;
  SmallArray<FunctionData_*,_32U> functions;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> assignments;
  FunctionData *local_3b8;
  SynBase *local_3b0;
  FunctionData *local_3a8;
  ExprBase *local_3a0;
  IntrusiveList<ExprBase> local_398;
  TypeBase *local_388;
  InplaceStr local_380;
  TraceScope local_370;
  SmallArray<FunctionData_*,_32U> local_360;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> local_248;
  undefined4 extraout_var_01;
  
  local_3b0 = source;
  if ((CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
       ::token == '\0') &&
     (iVar6 = __cxa_guard_acquire(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                                   ::token), iVar6 != 0)) {
    CreateVirtualTableUpdate::token = NULLC::TraceGetToken("analyze","CreateVirtualTableUpdate");
    __cxa_guard_release(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                         ::token);
    source = local_3b0;
  }
  NULLC::TraceScope::TraceScope(&local_370,CreateVirtualTableUpdate::token);
  local_398.head = (ExprBase *)0x0;
  local_398.tail = (ExprBase *)0x0;
  pcVar11 = (vtable->name->name).begin;
  local_380.begin = pcVar11 + 0xf;
  sVar7 = strlen(local_380.begin);
  local_380.end = pcVar11 + sVar7 + 0xf;
  pTVar14 = (TypeFunction *)0x0;
  uVar8 = strtoul(pcVar11 + 5,(char **)0x0,10);
  uVar1 = (ctx->types).count;
  if (uVar1 != 0) {
    lVar15 = 0;
    do {
      pTVar14 = (TypeFunction *)(ctx->types).data[lVar15];
      if ((pTVar14->super_TypeBase).nameHash == (uint)uVar8) {
        if ((pTVar14 != (TypeFunction *)0x0) && ((pTVar14->super_TypeBase).typeID == 0x15))
        goto LAB_0018c288;
        break;
      }
      lVar15 = lVar15 + 1;
    } while (uVar1 != (uint)lVar15);
    pTVar14 = (TypeFunction *)0x0;
  }
LAB_0018c288:
  if (pTVar14 == (TypeFunction *)0x0) {
    anon_unknown.dwarf_c6b42::Stop
              (ctx,source,"ERROR: Can\'t find function type for virtual function table \'%.*s\'",
               (ulong)(uint)(*(int *)&(vtable->name->name).end - (int)(vtable->name->name).begin));
  }
  if (vtable->importModule == (ModuleData *)0x0) {
    name_00.end = "";
    name_00.begin = "__typeCount";
    pEVar9 = CreateFunctionCall0(ctx,source,name_00,false,true,true);
    local_3a0 = CreateArrayAllocation(ctx,source,ctx->typeFunctionID,pEVar9);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)CONCAT44(extraout_var,iVar6),source,vtable->type,vtable);
    local_3a0 = CreateAssignment(ctx,source,(ExprBase *)CONCAT44(extraout_var,iVar6),local_3a0);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
    local_388 = ctx->typeVoid;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var10 = (_func_int **)CONCAT44(extraout_var_01,iVar6);
    *pp_Var10 = (_func_int *)0x0;
    pp_Var10[1] = (_func_int *)vtable;
    pp_Var10[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var10 + 3) = 0;
    pEVar9->typeID = 0x1e;
    pEVar9->source = source;
    pEVar9->type = local_388;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
    pEVar9[1]._vptr_ExprBase = pp_Var10;
    *(ExprBase **)&pEVar9[1].typeID = local_3a0;
    IntrusiveList<ExprBase>::push_back(&local_398,pEVar9);
  }
  local_360.allocator = ctx->allocator;
  local_360.data = local_360.little;
  local_360.count = 0;
  local_360.max = 0x20;
  if (functionSet->count != 0) {
    uVar8 = 0;
    do {
      pFVar2 = functionSet->data[uVar8];
      pMVar3 = pFVar2->scope->ownerType->importModule;
      if (((pMVar3 == (ModuleData *)0x0) || (pMVar3 != vtable->importModule)) &&
         (pFVar2->type == pTVar14)) {
        pcVar11 = strstr((pFVar2->name->name).begin,"::");
        local_248._0_8_ = pcVar11 + 2;
        sVar7 = strlen((char *)local_248._0_8_);
        local_248.data = (Node *)(pcVar11 + sVar7 + 2);
        bVar5 = InplaceStr::operator==((InplaceStr *)&local_248,&local_380);
        if (bVar5) {
          if (local_360.count == local_360.max) {
            SmallArray<FunctionData_*,_32U>::grow(&local_360,local_360.count);
          }
          if (local_360.data == (FunctionData **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<FunctionData *, 32>::push_back(const T &) [T = FunctionData *, N = 32]"
                         );
          }
          uVar13 = local_360._8_8_ & 0xffffffff;
          local_360.count = local_360.count + 1;
          local_360.data[uVar13] = pFVar2;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionSet->count);
  }
  local_248.allocator = ctx->allocator;
  local_248.data = local_248.storage;
  local_248._0_8_ = (char *)0x20;
  NULLC::fillMemory(local_248.data,0,0x200);
  source_00 = local_3b0;
  if (local_360.count != 0) {
    uVar8 = 0;
    do {
      local_3b8 = local_360.data[uVar8];
      local_3a8 = (FunctionData *)local_3b8->scope->ownerType;
      pEVar9 = CreateVirtualTableAssignment(ctx,source_00,vtable,(TypeBase *)local_3a8,local_3b8);
      IntrusiveList<ExprBase>::push_back(&local_398,pEVar9);
      if ((local_3a8 != (FunctionData *)0x0) && (*(int *)&local_3a8->importModule == 0x18)) {
        SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                  (&local_248,(TypeBase **)&local_3a8,&local_3b8);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (local_360._8_8_ & 0xffffffff));
  }
  if (classTypes->count != 0) {
    uVar8 = 0;
    do {
      pFVar2 = (FunctionData *)classTypes->data[uVar8];
      local_3b8 = pFVar2;
      ppFVar12 = SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::find
                           (&local_248,(TypeBase **)&local_3b8);
      pFVar16 = pFVar2;
      if (ppFVar12 == (FunctionData **)0x0) {
        do {
          pFVar16 = *(FunctionData **)&(pFVar16->arguments).little[3].isExplicit;
          if (pFVar16 == (FunctionData *)0x0) goto LAB_0018c614;
          local_3b8 = pFVar16;
          ppFVar12 = SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::find
                               (&local_248,(TypeBase **)&local_3b8);
        } while (ppFVar12 == (FunctionData **)0x0);
        local_3b8 = *ppFVar12;
        pEVar9 = CreateVirtualTableAssignment(ctx,local_3b0,vtable,(TypeBase *)pFVar2,local_3b8);
        IntrusiveList<ExprBase>::push_back(&local_398,pEVar9);
        local_3a8 = pFVar2;
        SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                  (&local_248,(TypeBase **)&local_3a8,&local_3b8);
      }
LAB_0018c614:
      uVar8 = uVar8 + 1;
    } while (uVar8 < classTypes->count);
  }
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar9 = (ExprBase *)CONCAT44(extraout_var_02,iVar6);
  pTVar4 = ctx->typeVoid;
  pEVar9->typeID = 0x36;
  pEVar9->source = local_3b0;
  pEVar9->type = pTVar4;
  pEVar9->next = (ExprBase *)0x0;
  pEVar9->listed = false;
  pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002490a0;
  pEVar9[1]._vptr_ExprBase = (_func_int **)local_398.head;
  *(ExprBase **)&pEVar9[1].typeID = local_398.tail;
  pEVar9[1].source = (SynBase *)0x0;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::~SmallDenseMap(&local_248);
  SmallArray<FunctionData_*,_32U>::~SmallArray(&local_360);
  NULLC::TraceScope::~TraceScope(&local_370);
  return pEVar9;
}

Assistant:

ExprBase* CreateVirtualTableUpdate(ExpressionContext &ctx, SynBase *source, VariableData *vtable, SmallArray<FunctionData*, 32> &functionSet, SmallArray<TypeClass*, 32> &classTypes)
{
	TRACE_SCOPE("analyze", "CreateVirtualTableUpdate");

	IntrusiveList<ExprBase> expressions;

	// Find function name
	InplaceStr name = InplaceStr(vtable->name->name.begin + 15); // 15 to skip $vtbl0123456789 from name

	// Find function type from name
	unsigned typeNameHash = strtoul(vtable->name->name.begin + 5, NULL, 10);

	TypeBase *functionType = NULL;

	for(unsigned i = 0; i < ctx.types.size(); i++)
	{
		if(ctx.types[i]->nameHash == typeNameHash)
		{
			functionType = getType<TypeFunction>(ctx.types[i]);
			break;
		}
	}

	if(!functionType)
		Stop(ctx, source, "ERROR: Can't find function type for virtual function table '%.*s'", FMT_ISTR(vtable->name->name));

	if(vtable->importModule == NULL)
	{
		ExprBase *count = CreateFunctionCall0(ctx, source, InplaceStr("__typeCount"), false, true, true);

		ExprBase *alloc = CreateArrayAllocation(ctx, source, ctx.typeFunctionID, count);

		ExprBase *assignment = CreateAssignment(ctx, source, new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, vtable->type, vtable), alloc);

		expressions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, vtable), assignment));
	}

	// Find all functions with called name that are member functions and have target type
	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	for(unsigned i = 0; i < functionSet.size(); i++)
	{
		FunctionData *function = functionSet[i];

		TypeBase *parentType = function->scope->ownerType;

		// If both type and table are imported, then it should have been filled up inside the module for that type
		if(parentType->importModule && vtable->importModule && parentType->importModule == vtable->importModule)
			continue;

		if(function->type != functionType)
			continue;

		const char *pos = strstr(function->name->name.begin, "::");

		if(InplaceStr(pos + 2) == name)
			functions.push_back(function);
	}

	SmallDenseMap<TypeBase*, FunctionData*, TypeBaseHasher, 32> assignments(ctx.allocator);

	// Handle direct assignments
	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i];
		TypeBase *type = function->scope->ownerType;

		expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

		// Record that owner type recevied an assignment to this function
		if(isType<TypeClass>(type))
			assignments.insert(type, function);
	}

	// Handle derived classes
	for(unsigned i = 0; i < classTypes.size(); i++)
	{
		TypeClass *type = classTypes[i];

		// Already assigned
		if(assignments.find(type))
			continue;

		// Not assigned directly, walk through base classes
		for(TypeClass *curr = type->baseClass; curr; curr = curr->baseClass)
		{
			if(FunctionData **assignment = assignments.find(curr))
			{
				FunctionData *function = *assignment;

				expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

				assignments.insert(type, function);
				break;
			}
		}
	}

	return new (ctx.get<ExprBlock>()) ExprBlock(source, ctx.typeVoid, expressions, NULL);
}